

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_pragma_function_info.cpp
# Opt level: O2

void __thiscall
duckdb::CreatePragmaFunctionInfo::CreatePragmaFunctionInfo
          (CreatePragmaFunctionInfo *this,string *name,PragmaFunctionSet *functions_p)

{
  allocator local_41;
  string local_40;
  
  ::std::__cxx11::string::string((string *)&local_40,"main",&local_41);
  CreateFunctionInfo::CreateFunctionInfo
            (&this->super_CreateFunctionInfo,PRAGMA_FUNCTION_ENTRY,&local_40);
  ::std::__cxx11::string::~string((string *)&local_40);
  (this->super_CreateFunctionInfo).super_CreateInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__CreatePragmaFunctionInfo_027a8160;
  FunctionSet<duckdb::PragmaFunction>::FunctionSet
            (&(this->functions).super_FunctionSet<duckdb::PragmaFunction>,
             &functions_p->super_FunctionSet<duckdb::PragmaFunction>);
  ::std::__cxx11::string::operator=((string *)&(this->super_CreateFunctionInfo).name,(string *)name)
  ;
  (this->super_CreateFunctionInfo).super_CreateInfo.internal = true;
  return;
}

Assistant:

CreatePragmaFunctionInfo::CreatePragmaFunctionInfo(string name, PragmaFunctionSet functions_p)
    : CreateFunctionInfo(CatalogType::PRAGMA_FUNCTION_ENTRY), functions(std::move(functions_p)) {
	this->name = std::move(name);
	internal = true;
}